

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
::OrParamConstraint(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                    *this,OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  ::OrParamConstraint(&this->cons1_,&param_1->cons1_);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(&this->cons2_,&param_1->cons2_);
  return;
}

Assistant:

OrParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << cons1_.getConstraintDescription() << " or "
          << cons2_.getConstraintDescription() << "";
      this->description_ = iss.str();
    }